

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

uint32 __thiscall
Js::RecyclableArrayWalker::GetItemCount(RecyclableArrayWalker *this,JavascriptArray *arrayObj)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  uint uVar4;
  undefined4 *puVar5;
  ArenaAllocator *alloc;
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar6;
  ulong uVar7;
  uint local_34 [2];
  uint32 absIndex;
  
  pLVar6 = this->pAbsoluteIndexList;
  if (pLVar6 == (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)0x0) {
    if (arrayObj == (JavascriptArray *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xb2f,"(arrayObj)","arrayObj");
      if (!bVar2) goto LAB_007edcb6;
      *puVar5 = 0;
    }
    alloc = GetArenaFromContext((this->super_RecyclableObjectWalker).scriptContext);
    pLVar6 = JsUtil::
             List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::New(alloc,4);
    this->pAbsoluteIndexList = pLVar6;
    if (pLVar6 == (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xb32,"(pAbsoluteIndexList)","pAbsoluteIndexList");
      if (!bVar2) {
LAB_007edcb6:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    local_34[0] = 0xffffffff;
    uVar3 = 0xffffffff;
    uVar7 = 0xffffffff;
    do {
      if (local_34[0] == uVar3) {
        uVar3 = JavascriptArray::GetNextIndex(arrayObj,local_34[0]);
      }
      if (local_34[0] == (uint32)uVar7) {
        uVar4 = (*(this->super_RecyclableObjectWalker).super_IDiagObjectModelWalkerBase.
                  _vptr_IDiagObjectModelWalkerBase[4])(this,uVar7);
        uVar7 = (ulong)uVar4;
      }
      local_34[0] = (uint)uVar7;
      if (uVar3 < (uint)uVar7) {
        local_34[0] = uVar3;
      }
      if ((local_34[0] == 0xffffffff) || ((arrayObj->super_ArrayObject).length <= local_34[0]))
      break;
      JsUtil::
      List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
                (this->pAbsoluteIndexList,local_34);
    } while (local_34[0] < (arrayObj->super_ArrayObject).length);
    pLVar6 = this->pAbsoluteIndexList;
  }
  return (pLVar6->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count;
}

Assistant:

uint32 RecyclableArrayWalker::GetItemCount(Js::JavascriptArray* arrayObj)
    {
        if (pAbsoluteIndexList == nullptr)
        {
            Assert(arrayObj);

            pAbsoluteIndexList = JsUtil::List<uint32, ArenaAllocator>::New(GetArenaFromContext(scriptContext));
            Assert(pAbsoluteIndexList);

            uint32 dataIndex = Js::JavascriptArray::InvalidIndex;
            uint32 descriptorIndex = Js::JavascriptArray::InvalidIndex;
            uint32 absIndex = Js::JavascriptArray::InvalidIndex;

            do
            {
                if (absIndex == dataIndex)
                {
                    dataIndex = arrayObj->GetNextIndex(dataIndex);
                }
                if (absIndex == descriptorIndex)
                {
                    descriptorIndex = GetNextDescriptor(descriptorIndex);
                }

                absIndex = min(dataIndex, descriptorIndex);

                if (absIndex == Js::JavascriptArray::InvalidIndex || absIndex >= arrayObj->GetLength())
                {
                    break;
                }

                pAbsoluteIndexList->Add(absIndex);

            } while (absIndex < arrayObj->GetLength());
        }

        return (uint32)pAbsoluteIndexList->Count();
    }